

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  Maze *this;
  ostream *poVar2;
  ifstream MazeStream;
  string local_240;
  char local_220 [520];
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2,
                    " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n");
    exit(1);
  }
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,(_Ios_Openmode)argv[1]);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::close();
    this = (Maze *)operator_new(0x2b8);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,"sampleInputForMaze.txt","");
    Maze::Maze(this,&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    Maze::pathBetweenCells(this);
    Maze::~Maze(this);
    operator_delete(this,0x2b8);
    std::ifstream::~ifstream(local_220);
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unable to open input file ->",0x1c);
  poVar2 = std::operator<<((ostream *)&std::cout,argv[1]);
  std::operator<<(poVar2,"<-\n");
  exit(2);
}

Assistant:

int main(int argc, char *argv[]) { // the main function.
    if( argc != 2) {
        std::cout << "usage: " << argv[0] << " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n";
        exit(1);
    }
    std::ifstream MazeStream;
    MazeStream.open(argv[1]);
    if( !MazeStream.is_open()) {
        std::cout << "Unable to open input file ->" << argv[1] << "<-\n";
        exit(2);
    }
    MazeStream.close();

    Maze *thePuzzle = new Maze("sampleInputForMaze.txt");
    //thePuzzle->printMaze();
    //std::cout<<std::endl;
    thePuzzle->pathBetweenCells();
    delete thePuzzle;
}